

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O1

REF_STATUS ref_list_create(REF_LIST *ref_list_ptr)

{
  REF_LIST pRVar1;
  REF_INT *pRVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  pRVar1 = (REF_LIST)malloc(0x10);
  *ref_list_ptr = pRVar1;
  if (pRVar1 == (REF_LIST)0x0) {
    pcVar4 = "malloc *ref_list_ptr of REF_LIST_STRUCT NULL";
    uVar3 = 0x1e;
  }
  else {
    pRVar1->n = 0;
    pRVar1->max = 10;
    pRVar2 = (REF_INT *)malloc(0x28);
    pRVar1->value = pRVar2;
    if (pRVar2 != (REF_INT *)0x0) {
      return 0;
    }
    pcVar4 = "malloc ref_list->value of REF_INT NULL";
    uVar3 = 0x25;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",uVar3,
         "ref_list_create",pcVar4);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_list_create(REF_LIST *ref_list_ptr) {
  REF_LIST ref_list;

  ref_malloc(*ref_list_ptr, 1, REF_LIST_STRUCT);

  ref_list = (*ref_list_ptr);

  ref_list_n(ref_list) = 0;
  ref_list_max(ref_list) = 10;

  ref_malloc(ref_list->value, ref_list_max(ref_list), REF_INT);

  return REF_SUCCESS;
}